

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall
Catch::CumulativeReporterBase::testCaseEnded
          (CumulativeReporterBase *this,TestCaseStats *testCaseStats)

{
  element_type *peVar1;
  shared_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>
  node;
  undefined1 local_28 [16];
  
  std::
  make_shared<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,Catch::CumulativeReporterBase::SectionNode>,Catch::TestCaseStats_const&>
            ((TestCaseStats *)local_28);
  if ((this->m_sectionStack).
      super__Vector_base<std::shared_ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->m_sectionStack).
      super__Vector_base<std::shared_ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    __assert_fail("m_sectionStack.size() == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/H-EAL[P]vfs/tests/catch_amalgamated.cpp"
                  ,0x1fe5,
                  "virtual void Catch::CumulativeReporterBase::testCaseEnded(const TestCaseStats &)"
                 );
  }
  std::
  vector<std::shared_ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
  ::push_back((vector<std::shared_ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
               *)&(((vector<Catch::Tag,_std::allocator<Catch::Tag>_> *)(local_28._0_8_ + 0x80))->
                  super__Vector_base<Catch::Tag,_std::allocator<Catch::Tag>_>)._M_impl.
                  super__Vector_impl_data._M_end_of_storage,&this->m_rootSection);
  std::
  vector<std::shared_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>
  ::push_back(&this->m_testCases,(value_type *)local_28);
  std::__shared_ptr<Catch::CumulativeReporterBase::SectionNode,_(__gnu_cxx::_Lock_policy)2>::reset
            (&(this->m_rootSection).
              super___shared_ptr<Catch::CumulativeReporterBase::SectionNode,_(__gnu_cxx::_Lock_policy)2>
            );
  peVar1 = (this->m_deepestSection).
           super___shared_ptr<Catch::CumulativeReporterBase::SectionNode,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  if (peVar1 != (element_type *)0x0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (&peVar1->stdOut,&testCaseStats->stdOut);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (&((this->m_deepestSection).
                 super___shared_ptr<Catch::CumulativeReporterBase::SectionNode,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->stdErr,&testCaseStats->stdErr);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_28 + 8));
    return;
  }
  __assert_fail("m_deepestSection",
                "/workspace/llm4binary/github/license_all_cmakelists_25/H-EAL[P]vfs/tests/catch_amalgamated.cpp"
                ,0x1fea,
                "virtual void Catch::CumulativeReporterBase::testCaseEnded(const TestCaseStats &)");
}

Assistant:

void CumulativeReporterBase::testCaseEnded(
        TestCaseStats const &testCaseStats) {
        auto node = std::make_shared<TestCaseNode>(testCaseStats);
        assert(m_sectionStack.size() == 0);
        node->children.push_back(m_rootSection);
        m_testCases.push_back(node);
        m_rootSection.reset();

        assert(m_deepestSection);
        m_deepestSection->stdOut = testCaseStats.stdOut;
        m_deepestSection->stdErr = testCaseStats.stdErr;
    }